

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compression_utils.cpp
# Opt level: O0

void convertIntArray2ByteArray_fast_1b_to_result_sz
               (uchar *intArray,size_t intArrayLength,uchar **compressed_pos)

{
  uchar *puVar1;
  int type;
  int tmp;
  size_t n;
  size_t j;
  size_t i;
  size_t byteLength;
  uchar **compressed_pos_local;
  size_t intArrayLength_local;
  uchar *intArray_local;
  
  if ((intArrayLength & 7) == 0) {
    byteLength = intArrayLength >> 3;
  }
  else {
    byteLength = (intArrayLength >> 3) + 1;
  }
  n = 0;
  for (i = 0; i < byteLength; i = i + 1) {
    tmp = 0;
    for (j = 0; j < 8 && n < intArrayLength; j = j + 1) {
      if (intArray[n] == '\x01') {
        tmp = tmp | 1 << (7U - (char)j & 0x1f);
      }
      n = n + 1;
    }
    puVar1 = *compressed_pos;
    *compressed_pos = puVar1 + 1;
    *puVar1 = (uchar)tmp;
  }
  return;
}

Assistant:

void 
convertIntArray2ByteArray_fast_1b_to_result_sz(const unsigned char* intArray, size_t intArrayLength, unsigned char *& compressed_pos){
	size_t byteLength = 0;
	size_t i, j; 
	if(intArrayLength%8==0)
		byteLength = intArrayLength/8;
	else
		byteLength = intArrayLength/8+1;
		
	size_t n = 0;
	int tmp, type;
	for(i = 0;i<byteLength;i++){
		tmp = 0;
		for(j = 0;j<8&&n<intArrayLength;j++){
			type = intArray[n];
			if(type == 1)
				tmp = (tmp | (1 << (7-j)));
			n++;
		}
    	*(compressed_pos++) = (unsigned char)tmp;
	}
}